

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar5.c
# Opt level: O1

wchar_t read_u32(archive_read *a,uint32_t *pvalue)

{
  wchar_t wVar1;
  uchar *p;
  uint32_t *puVar2;
  int64_t iVar3;
  ssize_t avail;
  ssize_t local_18;
  
  local_18 = -1;
  puVar2 = (uint32_t *)__archive_read_ahead(a,4,&local_18);
  if (puVar2 == (uint32_t *)0x0) {
    wVar1 = L'\0';
  }
  else {
    *pvalue = *puVar2;
    iVar3 = __archive_read_consume(a,4);
    wVar1 = (wchar_t)(iVar3 == 4);
  }
  return wVar1;
}

Assistant:

static int read_u32(struct archive_read* a, uint32_t* pvalue) {
	const uint8_t* p;
	if(!read_ahead(a, 4, &p))
		return 0;

	*pvalue = archive_le32dec(p);
	return ARCHIVE_OK == consume(a, 4) ? 1 : 0;
}